

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  uchar *ttf_data;
  long lVar3;
  ImFont *pIVar4;
  ulong uVar5;
  uchar *puVar6;
  ushort *puVar7;
  ushort *puVar8;
  byte bVar9;
  uint uVar10;
  ImFontConfig *pIVar11;
  uint ttf_size;
  byte bVar12;
  ImFontConfig local_98;
  
  pIVar2 = GImGui;
  bVar12 = 0;
  uVar10 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  ttf_data = (uchar *)(*(pIVar2->IO).MemAllocFn)((size_t)ttf_size);
  uVar10 = *compressed_ttf_data;
  if (((uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18) !=
       0x57bc0000) ||
     (uVar10 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar10 >> 0x18 != 0 || (uVar10 & 0xff0000) != 0) || (uVar10 & 0xff00) != 0) ||
     (uVar10 & 0xff) != 0)) {
LAB_00153338:
    if (font_cfg_template == (ImFontConfig *)0x0) {
      local_98.FontData = (void *)0x0;
      local_98.FontDataSize = 0;
      local_98.FontNo = 0;
      local_98.SizePixels = 0.0;
      local_98.OversampleH = 3;
      local_98.OversampleV = 1;
      local_98.PixelSnapH = false;
      local_98.GlyphExtraSpacing.x = 0.0;
      local_98.GlyphExtraSpacing.y = 0.0;
      local_98.DstFont = (ImFont *)0x0;
      local_98.GlyphRanges = (ImWchar *)0x0;
      local_98.MergeMode = false;
      local_98.MergeGlyphCenterV = false;
      local_98.Name[0] = '\0';
      local_98.Name[1] = '\0';
      local_98.Name[2] = '\0';
      local_98.Name[3] = '\0';
      local_98.Name[4] = '\0';
      local_98.Name[5] = '\0';
      local_98.Name[6] = '\0';
      local_98.Name[7] = '\0';
      local_98.Name[8] = '\0';
      local_98.Name[9] = '\0';
      local_98.Name[10] = '\0';
      local_98.Name[0xb] = '\0';
      local_98.Name[0xc] = '\0';
      local_98.Name[0xd] = '\0';
      local_98.Name[0xe] = '\0';
      local_98.Name[0xf] = '\0';
      local_98.Name[0x10] = '\0';
      local_98.Name[0x11] = '\0';
      local_98.Name[0x12] = '\0';
      local_98.Name[0x13] = '\0';
      local_98.Name[0x14] = '\0';
      local_98.Name[0x15] = '\0';
      local_98.Name[0x16] = '\0';
      local_98.Name[0x17] = '\0';
      local_98.Name[0x18] = '\0';
      local_98.Name[0x19] = '\0';
      local_98.Name[0x1a] = '\0';
      local_98.Name[0x1b] = '\0';
      local_98.Name[0x1c] = '\0';
      local_98.Name[0x1d] = '\0';
      local_98.Name[0x1e] = '\0';
      local_98.Name[0x1f] = '\0';
    }
    else {
      pIVar11 = &local_98;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        pIVar11->FontData = font_cfg_template->FontData;
        font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar12 * -0x10 + 8);
        pIVar11 = (ImFontConfig *)((long)pIVar11 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      if (local_98.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x4d0,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_98.FontDataOwnedByAtlas = true;
    pIVar4 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_98,glyph_ranges);
    return pIVar4;
  }
  uVar10 = *(uint *)((long)compressed_ttf_data + 8);
  stb__barrier3 = (uchar *)((ulong)(uint)compressed_ttf_size + (long)compressed_ttf_data);
  puVar6 = ttf_data +
           (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18);
  puVar7 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier2 = (uchar *)compressed_ttf_data;
  stb__barrier = puVar6;
  stb__barrier4 = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar9 = (byte)*puVar7;
    uVar10 = (uint)bVar9;
    if (bVar9 < 0x20) {
      if (bVar9 < 0x18) {
        if (bVar9 < 0x10) {
          if (bVar9 < 8) {
            if (bVar9 != 4) {
              if (uVar10 == 6) {
                uVar5 = ~((ulong)*(byte *)((long)puVar7 + 3) |
                          (ulong)*(byte *)((long)puVar7 + 1) << 0x10 | (ulong)(byte)puVar7[1] << 8);
                uVar10 = (uint)(byte)puVar7[2];
                goto LAB_001531de;
              }
              if (uVar10 == 7) {
                stb__lit((byte *)((long)puVar7 + 3),
                         (ushort)(*(ushort *)((long)puVar7 + 1) << 8 |
                                 *(ushort *)((long)puVar7 + 1) >> 8) + 1);
                uVar5 = (ulong)(ushort)(*(ushort *)((long)puVar7 + 1) << 8 |
                                       *(ushort *)((long)puVar7 + 1) >> 8);
                lVar3 = 4;
                goto LAB_00153290;
              }
              goto LAB_00153317;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar7 + 3) |
                         (ulong)*(byte *)((long)puVar7 + 1) << 0x10 | (ulong)(byte)puVar7[1] << 8),
                       (ushort)(puVar7[2] << 8 | puVar7[2] >> 8) + 1);
            puVar8 = puVar7 + 3;
          }
          else {
            stb__lit((uchar *)(puVar7 + 1),
                     ((uint)bVar9 * 0x100 + (uint)*(byte *)((long)puVar7 + 1)) - 0x7ff);
            uVar5 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
            lVar3 = -0x7fd;
LAB_00153290:
            puVar8 = (ushort *)((long)puVar7 + uVar5 + lVar3);
            if (puVar8 == puVar7) {
              bVar9 = (byte)*puVar7;
LAB_00153317:
              if ((bVar9 != 5) || (*(byte *)((long)puVar7 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                              ,0x8e8,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar6) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                              ,0x8e2,
                              "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              goto LAB_00153338;
            }
          }
        }
        else {
          uVar5 = -(ulong)(((uint)*(byte *)((long)puVar7 + 1) * 0x100 +
                           ((uint)(byte)puVar7[1] | (uint)bVar9 << 0x10)) - 0xfffff);
          uVar10 = (uint)(ushort)(*(ushort *)((long)puVar7 + 3) << 8 |
                                 *(ushort *)((long)puVar7 + 3) >> 8);
LAB_001531de:
          stb__match(stb__dout + uVar5,uVar10 + 1);
          puVar8 = (ushort *)((long)puVar7 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar7 + 1) * 0x100 +
                            ((uint)(byte)puVar7[1] | (uint)bVar9 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar7 + 3) + 1);
        puVar8 = puVar7 + 2;
      }
    }
    else if ((char)bVar9 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar7 + 1),uVar10 - 0x7f);
      puVar8 = puVar7 + 1;
    }
    else {
      if (bVar9 < 0x40) {
        stb__lit((byte *)((long)puVar7 + 1),uVar10 - 0x1f);
        uVar5 = (ulong)(byte)*puVar7;
        lVar3 = -0x1e;
        goto LAB_00153290;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar7 + 1) + (uint)bVar9 * 0x100) - 0x3fff),
                 (byte)puVar7[1] + 1);
      puVar8 = (ushort *)((long)puVar7 + 3);
    }
    puVar7 = puVar8;
    if (puVar6 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                    ,0x8ec,
                    "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}